

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler *
llama_sampler_init_logit_bias(int32_t n_vocab,int32_t n_logit_bias,llama_logit_bias *logit_bias)

{
  int32_t *ctx;
  llama_sampler *plVar1;
  allocator_type local_21;
  
  ctx = (int32_t *)operator_new(0x38);
  *ctx = n_vocab;
  std::vector<llama_logit_bias,std::allocator<llama_logit_bias>>::
  vector<llama_logit_bias_const*,void>
            ((vector<llama_logit_bias,std::allocator<llama_logit_bias>> *)(ctx + 2),logit_bias,
             logit_bias + n_logit_bias,&local_21);
  ctx[8] = 0;
  ctx[9] = 0;
  ctx[10] = 0;
  ctx[0xb] = 0;
  ctx[0xc] = 0;
  ctx[0xd] = 0;
  plVar1 = llama_sampler_init(&llama_sampler_logit_bias_i,ctx);
  return plVar1;
}

Assistant:

struct llama_sampler * llama_sampler_init_logit_bias(
                         int32_t   n_vocab,
                         int32_t   n_logit_bias,
          const llama_logit_bias * logit_bias) {
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_logit_bias_i,
        /* .ctx   = */ new llama_sampler_logit_bias {
            /* .n_vocab    = */ n_vocab,
            /* .logit_bias = */ std::vector<llama_logit_bias>(logit_bias, logit_bias + n_logit_bias),
            /* .to_search  = */ {},
        }
    );
}